

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserPOMDPFormat_Spirit.h
# Opt level: O2

void __thiscall
POMDPFormatParsing::ParserPOMDPFormat_Spirit::ClearCurMatrix(ParserPOMDPFormat_Spirit *this)

{
  _Vector_base<double,_std::allocator<double>_> local_28;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::clear(&this->_m_curMatrix);
  local_28._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_28._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  std::
  vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
  ::emplace_back<std::vector<double,std::allocator<double>>>
            ((vector<std::vector<double,std::allocator<double>>,std::allocator<std::vector<double,std::allocator<double>>>>
              *)&this->_m_curMatrix,(vector<double,_std::allocator<double>_> *)&local_28);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_28);
  this->_m_matrixModified = false;
  return;
}

Assistant:

void ClearCurMatrix()//TODO:move to proper place...
        {
            _m_curMatrix.clear();//no pointers stored, so this should not leak
            _m_curMatrix.push_back( std::vector<double>() );
            _m_matrixModified = false;
        }